

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v9::detail::
         do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>
                   (appender out,big_decimal_fp *f,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  char cVar1;
  numpunct *pnVar2;
  long lVar3;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar4;
  appender aVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  char *significand;
  int exp;
  digit_grouping<char> grouping;
  anon_class_40_8_dbbf3351 write;
  undefined1 local_d3 [27];
  big_decimal_fp *local_b8;
  undefined1 local_ac [8];
  int iStack_a4;
  long local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  char local_88;
  anon_class_72_9_0c6a3a8a local_80;
  _Alloc_hider local_38;
  
  local_d3._19_8_ = f->significand;
  local_d3._7_4_ = f->significand_size;
  local_d3[2] = 0x30;
  local_d3[1] = fspecs._5_1_;
  local_38._M_p = (pointer)fspecs;
  if ((int)local_d3._7_4_ < 0) {
LAB_00115450:
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                ,0x199,"negative value");
  }
  uVar16 = (ulong)((local_d3._7_4_ + 1) - (uint)(local_d3[1] == 0));
  uVar11 = fspecs._4_4_;
  local_d3[0] = '.';
  if ((uVar11 >> 0x11 & 1) != 0) {
    local_d3._11_8_ = specs;
    local_b8 = f;
    if (loc.locale_ == (void *)0x0) {
      std::locale::locale((locale *)&local_80);
    }
    else {
      std::locale::locale((locale *)&local_80,(locale *)loc.locale_);
    }
    pnVar2 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_80);
    cVar1 = (**(code **)(*(long *)pnVar2 + 0x10))(pnVar2);
    std::locale::~locale((locale *)&local_80);
    f = local_b8;
    specs = (basic_format_specs<char> *)local_d3._11_8_;
    local_d3[0] = cVar1;
  }
  uVar13 = f->exponent;
  iVar14 = local_d3._7_4_ + uVar13;
  iVar6 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_001150f7:
    iVar15 = local_d3._7_4_ + uVar13 + -1;
    if ((uVar11 >> 0x13 & 1) == 0) {
      uVar7 = 0;
      if (local_d3._7_4_ == 1) {
        local_d3[0] = '\0';
        uVar7 = 0;
      }
    }
    else {
      uVar7 = 0;
      if (0 < iVar6 - local_d3._7_4_) {
        uVar7 = (ulong)(uint)(iVar6 - local_d3._7_4_);
      }
      uVar16 = uVar16 + uVar7;
    }
    local_80.sign = (sign_t *)CONCAT71(local_80.sign._1_7_,local_d3[1]);
    local_80.significand = (char **)local_d3._19_8_;
    local_80.significand_size._0_5_ = CONCAT14(local_d3[0],local_d3._7_4_);
    local_80.f._0_5_ = CONCAT14(0x30,(int)uVar7);
    local_80.f = (big_decimal_fp *)
                 (CONCAT26(local_80.f._6_2_,
                           CONCAT15(((uVar11 >> 0x10 & 1) == 0) << 5,local_80.f._0_5_)) |
                 0x450000000000);
    local_80.grouping = (digit_grouping<char> *)CONCAT44(local_80.grouping._4_4_,iVar15);
    if (0 < specs->width) {
      if (iVar14 < 1) {
        iVar15 = 1 - iVar14;
      }
      lVar10 = 2;
      if (99 < iVar15) {
        lVar10 = (ulong)(999 < iVar15) + 3;
      }
      sVar8 = uVar16 + (3 - (ulong)(local_d3[0] == '\0')) + lVar10;
      aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_&>
                        (out,specs,sVar8,sVar8,(anon_class_40_8_dbbf3351 *)&local_80);
      return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    }
    cVar1 = local_d3[0];
    iVar6 = local_d3._7_4_;
    if ((ulong)local_d3[1] != 0) {
      cVar1 = ""[local_d3[1]];
      lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x10);
      uVar16 = lVar10 + 1;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                    + 0x18) < uVar16) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)();
        lVar10 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                 container + 0x10);
        uVar16 = lVar10 + 1;
      }
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                0x10) = uVar16;
      *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                container + 8) + lVar10) = cVar1;
      cVar1 = local_80.significand_size._4_1_;
      iVar6 = (int)local_80.significand_size;
    }
    bVar4.container =
         (buffer<char> *)
         write_significand<fmt::v9::appender,char>(out,(char *)local_80.significand,iVar6,1,cVar1);
    if (0 < (int)local_80.f) {
      bVar4.container =
           (buffer<char> *)
           fill_n<fmt::v9::appender,int,char>
                     ((appender)bVar4.container,(int)local_80.f,(char *)((long)&local_80.f + 4));
    }
    cVar1 = local_80.f._5_1_;
    sVar8 = (bVar4.container)->size_;
    uVar16 = sVar8 + 1;
    if ((bVar4.container)->capacity_ < uVar16) {
      (**(bVar4.container)->_vptr_buffer)(bVar4.container);
      sVar8 = (bVar4.container)->size_;
      uVar16 = sVar8 + 1;
    }
    (bVar4.container)->size_ = uVar16;
    (bVar4.container)->ptr_[sVar8] = cVar1;
    aVar5 = write_exponent<char,fmt::v9::appender>((int)local_80.grouping,(appender)bVar4.container)
    ;
    return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
           aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar15 = 0x10;
    if (0 < iVar6) {
      iVar15 = iVar6;
    }
    if ((iVar14 < -3) || (iVar15 < iVar14)) goto LAB_001150f7;
  }
  local_ac._0_4_ = iVar14;
  if ((int)uVar13 < 0) {
    if (iVar14 < 1) {
      iVar15 = -iVar14;
      local_ac._4_4_ = iVar15;
      if (SBORROW4(iVar6,iVar15) != iVar6 + iVar14 < 0) {
        local_ac._4_4_ = iVar6;
      }
      if (iVar6 < 0) {
        local_ac._4_4_ = iVar15;
      }
      if (local_d3._7_4_ != 0) {
        local_ac._4_4_ = iVar15;
      }
      if (local_d3._7_4_ == 0 && local_ac._4_4_ == 0) {
        local_d3[3] = (char)((uVar11 & 0x80000) >> 0x13);
        iVar6 = 2 - (uint)(((ulong)fspecs & 0x8000000000000) == 0);
      }
      else {
        local_d3[3] = 1;
        iVar6 = 2;
        if ((int)local_ac._4_4_ < 0) goto LAB_00115450;
      }
      sVar8 = (uint)(iVar6 + local_ac._4_4_) + uVar16;
      local_80.sign = local_d3 + 1;
      local_80.significand = (char **)(local_d3 + 2);
      local_80.significand_size = (int *)(local_d3 + 3);
      local_80.f = (big_decimal_fp *)local_d3;
      local_80.grouping = (digit_grouping<char> *)(local_ac + 4);
      local_80.fspecs = (float_specs *)(local_d3 + 0x13);
      local_80.decimal_point = local_d3 + 7;
      aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_&>
                        (out,specs,sVar8,sVar8,(anon_class_56_7_162c6e41 *)&local_80);
      return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    }
    iVar14 = 0;
    local_d3._3_4_ = iVar6 - local_d3._7_4_ & (int)(uVar11 << 0xc) >> 0x1f;
    uVar13 = local_d3._3_4_;
    if ((int)local_d3._3_4_ < 1) {
      uVar13 = 0;
    }
    local_d3._11_8_ = specs;
    digit_grouping<char>::digit_grouping
              ((digit_grouping<char> *)(local_ac + 4),loc,(bool)((byte)(uVar11 >> 0x11) & 1));
    if (local_88 != '\0') {
      pcVar12 = (char *)CONCAT44(iStack_a4,local_ac._4_4_);
      pcVar9 = pcVar12 + local_a0;
      lVar10 = 0;
      do {
        if (pcVar12 == pcVar9) {
          cVar1 = pcVar9[-1];
          pcVar12 = pcVar9;
        }
        else {
          cVar1 = *pcVar12;
          if ((byte)(cVar1 + 0x81U) < 0x82) goto LAB_00115472;
          pcVar12 = pcVar12 + 1;
        }
        iVar14 = iVar14 + cVar1;
        if ((int)local_d3._7_4_ <= iVar14) goto LAB_00115472;
        lVar10 = lVar10 + 1;
      } while( true );
    }
    lVar10 = 0;
LAB_00115472:
    sVar8 = uVar13 + uVar16 + lVar10 + 1;
    local_80.sign = local_d3 + 1;
    local_80.significand = (char **)(local_d3 + 0x13);
    local_80.significand_size = (int *)(local_d3 + 7);
    local_80.f = (big_decimal_fp *)local_ac;
    local_80.grouping = (digit_grouping<char> *)local_d3;
    local_80.decimal_point = local_d3 + 3;
    local_80.num_zeros = (int *)(local_d3 + 2);
    local_80.fspecs = (float_specs *)(local_ac + 4);
    bVar4.container =
         (buffer<char> *)
         write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_&>
                   (out,(basic_format_specs<char> *)local_d3._11_8_,sVar8,sVar8,
                    (anon_class_64_8_e6ffa566 *)&local_80);
    goto LAB_001154cd;
  }
  lVar10 = uVar13 + uVar16;
  local_d3._3_4_ = iVar6 - iVar14;
  if ((uVar11 >> 0x13 & 1) != 0) {
    lVar10 = lVar10 + 1;
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_d3._3_4_) {
      if ((int)local_d3._3_4_ < 1) goto LAB_00115347;
    }
    else {
      local_d3._3_4_ = 1;
    }
    lVar10 = lVar10 + (ulong)(uint)local_d3._3_4_;
  }
LAB_00115347:
  local_b8 = f;
  digit_grouping<char>::digit_grouping
            ((digit_grouping<char> *)(local_ac + 4),loc,(bool)((byte)(uVar11 >> 0x11) & 1));
  iVar6 = 0;
  if (local_88 != '\0') {
    pcVar12 = (char *)CONCAT44(iStack_a4,local_ac._4_4_);
    pcVar9 = pcVar12 + local_a0;
    lVar3 = 0;
    do {
      if (pcVar12 == pcVar9) {
        cVar1 = pcVar9[-1];
        pcVar12 = pcVar9;
      }
      else {
        cVar1 = *pcVar12;
        if ((byte)(cVar1 + 0x81U) < 0x82) goto LAB_001153af;
        pcVar12 = pcVar12 + 1;
      }
      iVar6 = iVar6 + cVar1;
      if (iVar14 <= iVar6) goto LAB_001153af;
      lVar3 = lVar3 + 1;
    } while( true );
  }
  lVar3 = 0;
LAB_001153af:
  local_80.sign = local_d3 + 1;
  local_80.significand = (char **)(local_d3 + 0x13);
  local_80.significand_size = (int *)(local_d3 + 7);
  local_80.f = local_b8;
  local_80.fspecs = (float_specs *)&local_38;
  local_80.decimal_point = local_d3;
  local_80.num_zeros = (int *)(local_d3 + 3);
  local_80.zero = local_d3 + 2;
  local_80.grouping = (digit_grouping<char> *)(local_ac + 4);
  bVar4.container =
       (buffer<char> *)
       write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_&>
                 (out,specs,lVar10 + lVar3,lVar10 + lVar3,&local_80);
LAB_001154cd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(iStack_a4,local_ac._4_4_) != &local_98) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(iStack_a4,local_ac._4_4_),local_98._M_allocated_capacity + 1);
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}